

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O3

error<idx2::err_code> idx2::ReadMetaData(cstr FileName,metadata *Meta)

{
  undefined4 *puVar1;
  dtype dVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  anon_union_8_2_2df48d06_for_stref_0 aVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  undefined8 uVar12;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar13;
  stref sVar14;
  error<idx2::err_code> eVar15;
  stref NameStr;
  undefined4 uVar16;
  anon_union_8_2_2df48d06_for_stref_0 local_108;
  int local_100;
  anon_union_8_2_2df48d06_for_stref_0 local_f8;
  undefined8 uStack_f0;
  char *local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  anon_union_8_2_2df48d06_for_stref_0 local_d0;
  int iStack_c8;
  undefined4 uStack_c4;
  anon_union_8_2_2df48d06_for_stref_0 local_c0;
  int local_b8;
  char *local_b0;
  cstr local_a8;
  anon_union_8_2_2df48d06_for_stref_0 local_a0;
  buffer local_98;
  anon_union_8_2_2df48d06_for_stref_0 local_80;
  int local_78;
  char *local_70;
  undefined4 local_68;
  undefined4 local_60;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  undefined4 local_38;
  
  if (Mallocator()::Instance == '\0') {
    ReadMetaData();
  }
  local_98.Data = (byte *)0x0;
  local_98.Bytes = 0;
  local_98.Alloc = (allocator *)&Mallocator()::Instance;
  eVar13 = ReadFile(FileName,&local_98);
  if (eVar13.Code == NoError) {
    local_58.Ptr = (str)local_98.Data;
    local_50 = (undefined4)local_98.Bytes;
    local_48 = "\r\n";
    local_40 = 2;
    local_38 = 0;
    local_a8 = FileName;
    sVar14 = Next((tokenizer *)&local_58);
    iVar6 = sVar14.Size;
    puVar8 = (undefined8 *)(*in_FS_OFFSET + -0x780);
    puVar1 = (undefined4 *)(*in_FS_OFFSET + -0x880);
    local_b0 = (char *)(*in_FS_OFFSET + -0xc80);
    local_a0.Ptr = Meta->Field;
    aVar7 = sVar14.field_0;
    while (aVar7.Ptr != (str)0x0) {
      local_70 = "=";
      local_68 = 1;
      local_60 = 0;
      local_80 = aVar7;
      local_78 = iVar6;
      sVar14 = Next((tokenizer *)&local_80);
      local_f8 = sVar14.field_0;
      uStack_f0._0_4_ = sVar14.Size;
      sVar14 = Trim((stref *)&local_f8);
      local_c0 = sVar14.field_0;
      local_b8 = sVar14.Size;
      sVar14 = Next((tokenizer *)&local_80);
      local_f8 = sVar14.field_0;
      uStack_f0 = CONCAT44(uStack_f0._4_4_,sVar14.Size);
      sVar14 = Trim((stref *)&local_f8);
      local_d0 = sVar14.field_0;
      iStack_c8 = sVar14.Size;
      if ((local_c0.Ptr == (str)0x0) || ((metadata *)local_d0.Ptr == (metadata *)0x0)) {
        *puVar8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
        ;
        *puVar1 = 0x5c;
        lVar9 = -0x1f8;
        goto LAB_0019c7ff;
      }
      local_f8.Ptr = "name";
      uStack_f0._0_4_ = 4;
      bVar5 = operator==((stref *)&local_c0,(stref *)&local_f8);
      if (bVar5) {
        uStack_f0 = CONCAT44(uStack_f0._4_4_,0x3f);
        local_f8 = (anon_union_8_2_2df48d06_for_stref_0)Meta;
        sVar14 = Trim((stref *)&local_d0);
        local_108 = sVar14.field_0;
        local_100 = sVar14.Size;
        Copy((stref *)&local_108,(stref *)&local_f8,true);
      }
      else {
        local_f8.Ptr = "field";
        uStack_f0._0_4_ = 5;
        bVar5 = operator==((stref *)&local_c0,(stref *)&local_f8);
        if (bVar5) {
          local_f8 = local_a0;
          uStack_f0 = CONCAT44(uStack_f0._4_4_,0x3f);
          sVar14 = Trim((stref *)&local_d0);
          local_108 = sVar14.field_0;
          local_100 = sVar14.Size;
          Copy((stref *)&local_108,(stref *)&local_f8,true);
        }
        else {
          local_f8.Ptr = "dimensions";
          uStack_f0._0_4_ = 10;
          bVar5 = operator==((stref *)&local_c0,(stref *)&local_f8);
          if (bVar5) {
            uStack_f0 = CONCAT44(uStack_c4,iStack_c8);
            local_f8.Ptr = local_d0.Ptr;
            local_e8 = " ";
            local_e0 = 1;
            local_d8 = 0;
            sVar14 = Next((tokenizer *)&local_f8);
            local_108 = sVar14.field_0;
            local_100 = sVar14.Size;
            if (local_108.Ptr == (str)0x0) {
              (Meta->Dims3).field_0.field_0.Z = 1;
            }
            else {
              lVar9 = 0;
              do {
                if (lVar9 == 0xc) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                bVar5 = ToInt((stref *)&local_108,(int *)(Meta->Field + lVar9 + 0x40));
                if (!bVar5) {
                  *puVar8 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                  ;
                  *puVar1 = 0x6f;
                  lVar9 = -0x1f8;
                  goto LAB_0019c790;
                }
                sVar14 = Next((tokenizer *)&local_f8);
                local_108 = sVar14.field_0;
                local_100 = sVar14.Size;
                lVar9 = lVar9 + 4;
              } while (local_108.Ptr != (str)0x0);
              if ((lVar9 == 0xc) || ((Meta->Dims3).field_0.field_0.Z = 1, lVar9 != 4))
              goto LAB_0019c5ae;
            }
            (Meta->Dims3).field_0.field_0.Y = 1;
          }
          else {
            local_f8.Ptr = "type";
            uStack_f0 = CONCAT44(uStack_f0._4_4_,4);
            bVar5 = operator==((stref *)&local_c0,(stref *)&local_f8);
            if (!bVar5) {
              *puVar8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
              ;
              *puVar1 = 0x7f;
              lVar9 = -0x1f8;
              goto LAB_0019c983;
            }
            local_f8.Ptr = local_d0.Ptr;
            uStack_f0 = CONCAT44(uStack_f0._4_4_,iStack_c8);
            lVar9 = 0;
            while (bVar5 = operator==((stref *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar9)
                                      ,(stref *)&local_f8), !bVar5) {
              lVar9 = lVar9 + 0x18;
              if (lVar9 == 0xf0) {
                Meta->DType = __Invalid__;
                goto LAB_0019c722;
              }
            }
            dVar2 = (&dtype_s::NameMap.Arr[0].ItemVal)[lVar9];
            Meta->DType = dVar2;
            if (dVar2 == __Invalid__) {
LAB_0019c722:
              *puVar8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
              ;
              *puVar1 = 0x7b;
              lVar9 = -0x1f8;
              goto LAB_0019c74a;
            }
          }
        }
      }
LAB_0019c5ae:
      sVar14 = Next((tokenizer *)&local_58);
      iVar6 = sVar14.Size;
      aVar7 = sVar14.field_0;
    }
    *puVar8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
    ;
    *puVar1 = 0x82;
    pcVar11 = "";
    uVar12 = 0;
LAB_0019c92c:
    eVar13.Code = (int)uVar12;
    eVar13.StackIdx = (char)((ulong)uVar12 >> 0x20);
    eVar13.StrGened = (bool)(char)((ulong)uVar12 >> 0x28);
    eVar13._14_2_ = (short)((ulong)uVar12 >> 0x30);
    eVar13.Msg = pcVar11;
    DeallocBuf(&local_98);
  }
  eVar15._8_8_ = eVar13._8_8_ & 0xffffffffffff;
  eVar15.Msg = eVar13.Msg;
  return eVar15;
  while (lVar9 = lVar9 + 0x18, lVar9 != 0) {
LAB_0019c7ff:
    if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == 0x11) {
      iVar6 = 0x11;
      goto LAB_0019c88c;
    }
  }
  iVar6 = 0x15;
LAB_0019c88c:
  lVar9 = 0;
  do {
    if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar9) == iVar6) {
      uVar12 = 0x10000000011;
      puVar8 = (undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
      uVar16 = 0x5c;
      goto LAB_0019c8d5;
    }
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x1f8);
  goto LAB_0019c8a0;
  while (lVar9 = lVar9 + 0x18, lVar9 != 0) {
LAB_0019c74a:
    if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == 9) {
      iVar6 = 9;
      goto LAB_0019c81b;
    }
  }
  iVar6 = 0x15;
LAB_0019c81b:
  lVar9 = 0;
LAB_0019c81d:
  if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar9) != iVar6) goto code_r0x0019c823;
  puVar8 = (undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
  uVar12 = 0x10000000009;
  uVar16 = 0x7b;
LAB_0019c8d5:
  uVar10 = *puVar8;
  uVar3 = *(uint *)(puVar8 + 1);
  goto LAB_0019c8de;
code_r0x0019c823:
  lVar9 = lVar9 + 0x18;
  if (lVar9 == 0x1f8) goto LAB_0019c8a0;
  goto LAB_0019c81d;
  while (lVar9 = lVar9 + 0x18, lVar9 != 0) {
LAB_0019c790:
    if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == 0x11) {
      iVar6 = 0x11;
      goto LAB_0019c855;
    }
  }
  iVar6 = 0x15;
LAB_0019c855:
  lVar9 = 0;
LAB_0019c857:
  if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar9) != iVar6) goto code_r0x0019c85d;
  uVar12 = 0x10000000011;
  uVar10 = *(undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
  uVar3 = *(uint *)((long)&err_code_s::NameMap.Arr[0].Name.Size + lVar9);
  uVar16 = 0x6f;
LAB_0019c8de:
  pcVar4 = local_b0;
  iVar6 = snprintf(local_b0,0x400,"%.*s (file %s, line %d): ",(ulong)uVar3,uVar10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                   ,uVar16);
  pcVar11 = "File %s";
  snprintf(pcVar4 + iVar6,0x400 - (long)iVar6,"File %s",local_a8);
  goto LAB_0019c92c;
code_r0x0019c85d:
  lVar9 = lVar9 + 0x18;
  if (lVar9 == 0x1f8) goto LAB_0019c8a0;
  goto LAB_0019c857;
  while (lVar9 = lVar9 + 0x18, lVar9 != 0) {
LAB_0019c983:
    if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == 7) {
      iVar6 = 7;
      goto LAB_0019c99f;
    }
  }
  iVar6 = 0x15;
LAB_0019c99f:
  lVar9 = 0;
  do {
    if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar9) == iVar6) {
      puVar8 = (undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
      uVar12 = 0x10000000007;
      uVar16 = 0x7f;
      goto LAB_0019c8d5;
    }
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x1f8);
LAB_0019c8a0:
  __assert_fail("It != End(EnumS.NameMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/ErrorCodes.h"
                ,0xc,"stref idx2::ToString(err_code)");
}

Assistant:

error<>
ReadMetaData(cstr FileName, metadata* Meta)
{
  buffer Buf;
  error Ok = ReadFile(FileName, &Buf);
  if (Ok.Code != err_code::NoError)
    return Ok;
  idx2_CleanUp(0, DeallocBuf(&Buf));
  stref Str((cstr)Buf.Data, (int)Buf.Bytes);
  tokenizer TkLine(Str, "\r\n");
  for (stref Line = Next(&TkLine); Line; Line = Next(&TkLine))
  {
    tokenizer TkEq(Line, "=");
    stref Attr = Trim(Next(&TkEq));
    stref Value = Trim(Next(&TkEq));
    if (!Attr || !Value)
      return idx2_Error(err_code::ParseFailed, "File %s", FileName);

    if (Attr == "name")
    {
      stref NameStr = idx2_StRef(Meta->Name);
      Copy(Trim(Value), &NameStr);
    }
    else if (Attr == "field")
    {
      stref FieldStr = idx2_StRef(Meta->Field);
      Copy(Trim(Value), &FieldStr);
    }
    else if (Attr == "dimensions")
    {
      tokenizer TkSpace(Value, " ");
      int D = 0;
      for (stref Dim = Next(&TkSpace); Dim && D < 4; Dim = Next(&TkSpace), ++D)
      {
        if (!ToInt(Dim, &Meta->Dims3[D]))
          return idx2_Error(err_code::ParseFailed, "File %s", FileName);
      }
      if (D >= 4)
        return idx2_Error(err_code::DimensionsTooMany, "File %s", FileName);
      if (D <= 2)
        Meta->Dims3[2] = 1;
      if (D <= 1)
        Meta->Dims3[1] = 1;
    }
    else if (Attr == "type")
    {
      if ((Meta->DType = StringTo<dtype>()(Value)) == dtype::__Invalid__)
        return idx2_Error(err_code::TypeNotSupported, "File %s", FileName);
    }
    else
    {
      return idx2_Error(err_code::AttributeNotFound, "File %s", FileName);
    }
  }
  return idx2_Error(err_code::NoError);
}